

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

void __thiscall llvm::yaml::MappingNode::increment(MappingNode *this)

{
  Token *pTVar1;
  KeyValueNode *this_00;
  Token local_110;
  undefined1 local_d8 [56];
  Token local_a0;
  undefined1 local_68 [8];
  Token T;
  
  if ((*(char *)(*(long *)&((((this->super_Node).Doc)->_M_t).
                            super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                            .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                           stream->scanner + 0x4a) == '\x01') ||
     ((this->CurrentEntry != (KeyValueNode *)0x0 &&
      (KeyValueNode::skip(this->CurrentEntry), this->Type == MT_Inline)))) {
    this->IsAtEnd = true;
    this->CurrentEntry = (KeyValueNode *)0x0;
    return;
  }
  pTVar1 = Node::peekNext(&this->super_Node);
  Token::Token((Token *)local_68,pTVar1);
  if ((local_68._0_4_ & ~TK_StreamEnd) == TK_Key) {
    this_00 = (KeyValueNode *)
              Node::operator_new(0x58,&((((this->super_Node).Doc)->_M_t).
                                        super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                        .super__Head_base<0UL,_llvm::yaml::Document_*,_false>.
                                       _M_head_impl)->NodeAllocator,0x10);
    if (this_00 != (KeyValueNode *)0x0) {
      KeyValueNode::KeyValueNode(this_00,(this->super_Node).Doc);
    }
  }
  else {
    if (this->Type == MT_Block) {
      if (local_68._0_4_ != TK_Error) {
        if (local_68._0_4_ == TK_BlockEnd) {
          Node::getNext(&local_110,&this->super_Node);
          pTVar1 = &local_110;
          goto LAB_00dcb0bd;
        }
        Twine::Twine((Twine *)((long)&T.Value.field_2 + 8),
                     "Unexpected token. Expected Key or Block End");
        Node::setError(&this->super_Node,(Twine *)((long)&T.Value.field_2 + 8),(Token *)local_68);
      }
    }
    else if (local_68._0_4_ != TK_Error) {
      if (local_68._0_4_ == TK_FlowMappingEnd) {
        Node::getNext(&local_a0,&this->super_Node);
        pTVar1 = &local_a0;
LAB_00dcb0bd:
        std::__cxx11::string::~string((string *)&pTVar1->Value);
      }
      else {
        if (local_68._0_4_ == TK_FlowEntry) {
          Node::getNext((Token *)local_d8,&this->super_Node);
          std::__cxx11::string::~string((string *)(local_d8 + 0x18));
          increment(this);
          goto LAB_00dcb111;
        }
        Twine::Twine((Twine *)((long)&T.Value.field_2 + 8),
                     "Unexpected token. Expected Key, Flow Entry, or Flow Mapping End.");
        Node::setError(&this->super_Node,(Twine *)((long)&T.Value.field_2 + 8),(Token *)local_68);
      }
    }
    this->IsAtEnd = true;
    this_00 = (KeyValueNode *)0x0;
  }
  this->CurrentEntry = this_00;
LAB_00dcb111:
  std::__cxx11::string::~string((string *)&T.Range.Length);
  return;
}

Assistant:

void MappingNode::increment() {
  if (failed()) {
    IsAtEnd = true;
    CurrentEntry = nullptr;
    return;
  }
  if (CurrentEntry) {
    CurrentEntry->skip();
    if (Type == MT_Inline) {
      IsAtEnd = true;
      CurrentEntry = nullptr;
      return;
    }
  }
  Token T = peekNext();
  if (T.Kind == Token::TK_Key || T.Kind == Token::TK_Scalar) {
    // KeyValueNode eats the TK_Key. That way it can detect null keys.
    CurrentEntry = new (getAllocator()) KeyValueNode(Doc);
  } else if (Type == MT_Block) {
    switch (T.Kind) {
    case Token::TK_BlockEnd:
      getNext();
      IsAtEnd = true;
      CurrentEntry = nullptr;
      break;
    default:
      setError("Unexpected token. Expected Key or Block End", T);
      LLVM_FALLTHROUGH;
    case Token::TK_Error:
      IsAtEnd = true;
      CurrentEntry = nullptr;
    }
  } else {
    switch (T.Kind) {
    case Token::TK_FlowEntry:
      // Eat the flow entry and recurse.
      getNext();
      return increment();
    case Token::TK_FlowMappingEnd:
      getNext();
      LLVM_FALLTHROUGH;
    case Token::TK_Error:
      // Set this to end iterator.
      IsAtEnd = true;
      CurrentEntry = nullptr;
      break;
    default:
      setError( "Unexpected token. Expected Key, Flow Entry, or Flow "
                "Mapping End."
              , T);
      IsAtEnd = true;
      CurrentEntry = nullptr;
    }
  }
}